

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.cc
# Opt level: O0

string * bf_crc::number_to_str_abi_cxx11_(uint64_t v)

{
  ulong in_RSI;
  string *in_RDI;
  format f_4;
  format f_3;
  format f_2;
  format f_1;
  format f;
  unsigned_long *in_stack_fffffffffffffb28;
  unsigned_long *x;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb30;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  unsigned_long local_498 [6];
  char *in_stack_fffffffffffffb98;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba8;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  ulong local_2d0;
  ulong local_1e8;
  ulong local_10;
  
  if (in_RSI < 1000) {
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
              (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (in_stack_fffffffffffffba8);
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
              (in_stack_fffffffffffffb30);
  }
  else {
    local_10 = in_RSI;
    if (in_RSI < 1000000) {
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      local_1e8 = local_10 / 1000;
      boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
                (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
      boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
                (in_stack_fffffffffffffba8);
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
                (in_stack_fffffffffffffb30);
    }
    else if (in_RSI < 1000000000) {
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      local_2d0 = local_10 / 1000000;
      boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
                (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
      boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
                (in_stack_fffffffffffffba8);
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
                (in_stack_fffffffffffffb30);
    }
    else if (in_RSI < 1000000000000) {
      this = &local_3b0;
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
                (this,in_stack_fffffffffffffb28);
      boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
                (in_stack_fffffffffffffba8);
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format(this);
    }
    else {
      x = local_498;
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
                (in_stack_fffffffffffffb30,x);
      boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
                (in_stack_fffffffffffffba8);
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
                (in_stack_fffffffffffffb30);
    }
  }
  return in_RDI;
}

Assistant:

std::string bf_crc::number_to_str(uint64_t v) {
  if(v < 1000) {
    boost::format f("%1%");
    f % v;
    return f.str();
  }
  else if(v < 1000*1000) {
    boost::format f("%1%k");
    f % (v/1000);
    return f.str();
  }
  else if(v < 1000*1000*1000) {
    boost::format f("%1%M");
    f % (v/1000000);
    return f.str();
  }
  else if(v < 1000*1000*1000*1000L) {
    boost::format f("%1%B");
    f % (v/1000000000L);
    return f.str();
  }
  else {
    boost::format f("%1%T");
    f % (v/1000000000000);
    return f.str();
  }
  
}